

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_interp.c
# Opt level: O2

REF_STATUS
ref_update_agent_tet_seed
          (REF_INTERP ref_interp,REF_INT id,REF_INT node0,REF_INT node1,REF_INT node2)

{
  REF_INT RVar1;
  REF_NODE ref_node;
  REF_CELL ref_cell;
  REF_AGENTS pRVar2;
  REF_AGENT_STRUCT *pRVar3;
  uint uVar4;
  int iVar5;
  REF_INT *pRVar6;
  long lVar7;
  long lVar8;
  REF_INT cell1;
  REF_INT cell0;
  REF_INT face_nodes [4];
  REF_INT tri;
  
  ref_node = ref_interp->from_grid->node;
  ref_cell = ref_interp->from_tri;
  pRVar2 = ref_interp->ref_agents;
  face_nodes[0] = node0;
  face_nodes[1] = node1;
  face_nodes[2] = node2;
  face_nodes[3] = node0;
  uVar4 = ref_cell_with_face(ref_interp->from_tet,face_nodes,&cell0,&cell1);
  if (uVar4 == 0) {
    if (cell0 == -1) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c",
             0x209,"ref_update_agent_tet_seed","bary update missing first");
      uVar4 = 1;
    }
    else {
      if (cell1 == -1) {
        pRVar6 = ref_node->part;
        iVar5 = ref_node->ref_mpi->id;
        if (((iVar5 == pRVar6[node0]) || (iVar5 == pRVar6[node1])) || (iVar5 == pRVar6[node2])) {
          uVar4 = ref_cell_with(ref_cell,face_nodes,&tri);
          if (uVar4 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c"
                   ,0x217,"ref_update_agent_tet_seed",(ulong)uVar4,"boundary tri expected");
            return uVar4;
          }
          pRVar2->agent[id].mode = REF_AGENT_AT_BOUNDARY;
        }
        else {
          iVar5 = rand();
          iVar5 = face_nodes[iVar5 % 3];
          lVar7 = (long)iVar5;
          RVar1 = ref_node->part[lVar7];
          pRVar3 = pRVar2->agent;
          pRVar3[id].seed = -1;
          pRVar3[id].part = RVar1;
          lVar8 = -1;
          if ((-1 < lVar7) && (iVar5 < ref_node->max)) {
            lVar8 = -1;
            if (-1 < ref_node->global[lVar7]) {
              lVar8 = ref_node->global[lVar7];
            }
          }
          pRVar3[id].global = lVar8;
          pRVar3[id].mode = REF_AGENT_HOP_PART;
        }
      }
      else {
        pRVar6 = &pRVar2->agent[id].seed;
        if (*pRVar6 == cell0) {
          *pRVar6 = cell1;
        }
        else {
          if (*pRVar6 != cell1) {
            return 5;
          }
          *pRVar6 = cell0;
        }
      }
      uVar4 = 0;
    }
  }
  else {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c",0x208,
           "ref_update_agent_tet_seed",(ulong)uVar4,"cells with walk face");
    ref_node_location(ref_node,face_nodes[0]);
    ref_node_location(ref_node,face_nodes[1]);
    ref_node_location(ref_node,face_nodes[2]);
    ref_node_location(ref_node,face_nodes[3]);
  }
  return uVar4;
}

Assistant:

REF_FCN static REF_STATUS ref_update_agent_tet_seed(REF_INTERP ref_interp,
                                                    REF_INT id, REF_INT node0,
                                                    REF_INT node1,
                                                    REF_INT node2) {
  REF_NODE ref_node = ref_grid_node(ref_interp_from_grid(ref_interp));
  REF_CELL tets = ref_interp_from_tet(ref_interp);
  REF_CELL tris = ref_interp_from_tri(ref_interp);
  REF_AGENTS ref_agents = ref_interp->ref_agents;
  REF_INT face_nodes[4], cell0, cell1;
  REF_INT tri, node;

  face_nodes[0] = node0;
  face_nodes[1] = node1;
  face_nodes[2] = node2;
  face_nodes[3] = node0;

  RSB(ref_cell_with_face(tets, face_nodes, &cell0, &cell1),
      "cells with walk face", {
        ref_node_location(ref_node, face_nodes[0]);
        ref_node_location(ref_node, face_nodes[1]);
        ref_node_location(ref_node, face_nodes[2]);
        ref_node_location(ref_node, face_nodes[3]);
      });
  if (REF_EMPTY == cell0) THROW("bary update missing first");
  if (REF_EMPTY == cell1) {
    /* if it is off proc */
    if (!ref_node_owned(ref_node, node0) && !ref_node_owned(ref_node, node1) &&
        !ref_node_owned(ref_node, node2)) {
      /* pick at pseudo random */
      node = face_nodes[rand() % 3];
      ref_agent_part(ref_agents, id) = ref_node_part(ref_node, node);
      ref_agent_seed(ref_agents, id) = REF_EMPTY;
      ref_agent_global(ref_agents, id) = ref_node_global(ref_node, node);
      ref_agent_mode(ref_agents, id) = REF_AGENT_HOP_PART;
      return REF_SUCCESS;
    }
    /* hit boundary, but verifying */
    RSS(ref_cell_with(tris, face_nodes, &tri), "boundary tri expected");
    ref_agent_mode(ref_agents, id) = REF_AGENT_AT_BOUNDARY;
    return REF_SUCCESS;
  }

  if (ref_agent_seed(ref_agents, id) == cell0) {
    ref_agent_seed(ref_agents, id) = cell1;
    return REF_SUCCESS;
  }
  if (ref_agent_seed(ref_agents, id) == cell1) {
    ref_agent_seed(ref_agents, id) = cell0;
    return REF_SUCCESS;
  }

  return REF_NOT_FOUND;
}